

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathfinderDVL.cpp
# Opt level: O3

void * PathfinderDVLThread(void *pParam)

{
  ulong uVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  CHRONO chrono_period;
  char szTemp [256];
  NMEADATA nmeadata;
  PATHFINDERDVL pathfinderdvl;
  char szSaveFilePath [256];
  double local_c68;
  double local_c60;
  interval local_c58;
  int local_c40;
  int local_c3c;
  interval local_c38;
  interval local_c20;
  double local_c08;
  timespec local_c00;
  undefined1 local_bf0 [16];
  undefined1 local_be0 [16];
  timespec local_bd0;
  int local_bc0;
  char cStack_bb9;
  undefined6 local_bb8;
  undefined2 uStack_bb2;
  undefined6 uStack_bb0;
  NMEADATA local_ab0;
  PATHFINDERDVL local_6d8;
  char local_138 [264];
  
  memset(&local_6d8,0,0x5a0);
  memset(&local_ab0,0,0x3d8);
  iVar5 = clock_getres(4,&local_bd0);
  if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_c00), iVar5 == 0)) {
    local_bc0 = 0;
    local_bf0 = (undefined1  [16])0x0;
    local_be0 = (undefined1  [16])0x0;
  }
  local_c40 = 100;
  bVar3 = false;
  local_c3c = 0;
  do {
    bVar3 = !bVar3;
    while( true ) {
      if (local_bc0 == 0) {
        clock_gettime(4,(timespec *)&local_c58);
        local_bf0._8_8_ = local_c58.sup;
        local_bf0._0_8_ = local_c58.inf;
        local_c58.inf =
             (double)((((long)local_c58.inf + local_be0._0_8_) - local_c00.tv_sec) +
                     ((long)local_c58.sup + local_be0._8_8_) / 1000000000);
        local_c58.sup =
             (double)(((long)local_c58.sup + local_be0._8_8_) % 1000000000 - local_c00.tv_nsec);
        if ((long)local_c58.sup < 0) {
          local_c58.inf =
               (double)((long)local_c58.inf + ~((ulong)-(long)local_c58.sup / 1000000000));
          local_c58.sup =
               (double)((long)local_c58.sup + 1000000000 +
                       ((ulong)-(long)local_c58.sup / 1000000000) * 1000000000);
        }
        local_be0._8_8_ = local_c58.sup;
        local_be0._0_8_ = local_c58.inf;
      }
      iVar5 = clock_getres(4,&local_bd0);
      if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_c00), iVar5 == 0)) {
        local_bc0 = 0;
        local_be0 = (undefined1  [16])0x0;
        local_bf0 = (undefined1  [16])0x0;
      }
      if (bPausePathfinderDVL == 0) break;
      if (!bVar3) {
        puts("PathfinderDVL paused.");
        DisconnectPathfinderDVL(&local_6d8);
      }
      if (bExit != 0) goto LAB_001adcef;
      local_c58.inf = 0.0;
      local_c58.sup = 4.94065645841247e-316;
      nanosleep((timespec *)&local_c58,(timespec *)0x0);
      bVar3 = true;
    }
    if (bRestartPathfinderDVL == 0) {
      if (bVar3) goto LAB_001ad5e5;
      iVar5 = GetNMEASentencePathfinderDVL(&local_6d8,&local_ab0);
      if (iVar5 == 0) {
        iVar5 = pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        auVar9._0_4_ = -(uint)(local_6d8.bEnable_PD6_SA == 0);
        auVar9._4_4_ = -(uint)(local_6d8.bEnable_PD6_TS == 0);
        auVar9._8_4_ = -(uint)(local_6d8.bEnable_PD6_BI == 0);
        auVar9._12_4_ = -(uint)(local_6d8.bEnable_PD6_BS == 0);
        iVar5 = movmskps(iVar5,auVar9);
        if (((iVar5 != 0xf) || (local_6d8.bEnable_PD6_BE != 0)) || (local_6d8.bEnable_PD6_BD != 0))
        {
          if ((~auVar9._0_4_ & 1) != 0) {
            dVar8 = fmod((1.5707963267948966 - local_ab0.Heading) - angle_env,6.283185307179586);
            local_c68 = fmod(dVar8 + 9.42477796076938,6.283185307179586);
            local_c68 = local_c68 + -3.141592653589793;
            interval::interval(&local_c20,&local_c68);
            local_c60 = -psi_ahrs_acc;
            interval::interval(&local_c38,&local_c60,&psi_ahrs_acc);
            operator+(&local_c20,&local_c38);
            interval::operator=((interval *)&psi_ahrs,&local_c58);
            local_c68 = -local_ab0.Pitch;
            interval::interval(&local_c20,&local_c68);
            local_c60 = -theta_ahrs_acc;
            interval::interval(&local_c38,&local_c60,&theta_ahrs_acc);
            operator+(&local_c20,&local_c38);
            interval::operator=((interval *)&theta_ahrs,&local_c58);
            interval::interval(&local_c20,&local_ab0.Roll);
            local_c68 = (double)((ulong)phi_ahrs_acc ^ (ulong)DAT_001cc0e0);
            interval::interval(&local_c38,&local_c68,&phi_ahrs_acc);
            operator+(&local_c20,&local_c38);
            interval::operator=((interval *)&phi_ahrs,&local_c58);
          }
          if (local_6d8.bEnable_PD6_BS != 0) {
            if (local_ab0.vstatus_ship == 'V') {
              local_c20.inf = -10000.0;
              local_c38.inf = 10000.0;
              interval::interval(&local_c58,&local_c20.inf,&local_c38.inf);
              interval::operator=((interval *)&vrx_dvl,&local_c58);
              local_c20.inf = -10000.0;
              local_c38.inf = 10000.0;
              interval::interval(&local_c58,&local_c20.inf,&local_c38.inf);
              interval::operator=((interval *)&vry_dvl,&local_c58);
              local_c20.inf = -10000.0;
              local_c38.inf = 10000.0;
              interval::interval(&local_c58,&local_c20.inf,&local_c38.inf);
            }
            else {
              if (local_ab0.vstatus_ship != 'A') goto LAB_001adbaf;
              interval::interval(&local_c20,&local_ab0.vl_ship);
              local_c68 = -dvl_acc;
              interval::interval(&local_c38,&local_c68,&dvl_acc);
              operator+(&local_c20,&local_c38);
              interval::operator=((interval *)&vrx_dvl,&local_c58);
              local_c68 = -local_ab0.vt_ship;
              interval::interval(&local_c20,&local_c68);
              local_c60 = -dvl_acc;
              interval::interval(&local_c38,&local_c60,&dvl_acc);
              operator+(&local_c20,&local_c38);
              interval::operator=((interval *)&vry_dvl,&local_c58);
              interval::interval(&local_c20,&local_ab0.vn_ship);
              local_c68 = (double)((ulong)dvl_acc ^ (ulong)DAT_001cc0e0);
              interval::interval(&local_c38,&local_c68,&dvl_acc);
              operator+(&local_c20,&local_c38);
            }
            interval::operator=((interval *)&vrz_dvl,&local_c58);
          }
LAB_001adbaf:
          if ((local_6d8.bEnable_PD6_BE != 0) && (local_ab0.vstatus_earth == 'A')) {
            sog = local_ab0.SOG;
            dVar8 = fmod((1.5707963267948966 - local_ab0.COG) - angle_env,6.283185307179586);
            local_c68 = fmod(dVar8 + 9.42477796076938,6.283185307179586);
            local_c68 = local_c68 + -3.141592653589793;
            interval::interval(&local_c20,&local_c68);
            local_c60 = -3.141592653589793;
            local_c08 = 3.141592653589793;
            interval::interval(&local_c38,&local_c60,&local_c08);
            operator+(&local_c20,&local_c38);
            interval::operator=((interval *)&psi_dvl,&local_c58);
          }
          if ((local_6d8.bEnable_PD6_BD != 0) && (local_ab0.timesincelastgood < 4.0)) {
            altitude_AGL = local_ab0.Altitude_AGL;
          }
        }
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        goto LAB_001adcce;
      }
      puts("Connection to a PathfinderDVL lost.");
      DisconnectPathfinderDVL(&local_6d8);
      local_c58.inf = (double)(long)(local_c40 / 1000);
      local_c58.sup = (double)(long)((local_c40 % 1000) * 1000000);
LAB_001ad60a:
      nanosleep((timespec *)&local_c58,(timespec *)0x0);
      local_c3c = local_c3c + 1;
      if (ExitOnErrorCount <= local_c3c && 0 < ExitOnErrorCount) {
        bExit = 1;
LAB_001adcef:
        bVar4 = true;
        goto LAB_001adcf1;
      }
      bVar3 = false;
      bVar4 = true;
    }
    else {
      if (!bVar3) {
        puts("Restarting a PathfinderDVL.");
        DisconnectPathfinderDVL(&local_6d8);
      }
      bRestartPathfinderDVL = 0;
LAB_001ad5e5:
      iVar5 = ConnectPathfinderDVL(&local_6d8,"PathfinderDVL0.txt");
      if (iVar5 != 0) {
        local_c58.inf = 4.94065645841247e-324;
        local_c58.sup = 0.0;
        goto LAB_001ad60a;
      }
      local_c40 = local_6d8.threadperiod;
      memset(&local_ab0,0,0x3d8);
      if ((FILE *)local_6d8.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_6d8.pfSaveFile);
        local_6d8.pfSaveFile = (FILE *)0x0;
      }
      bVar3 = true;
      if (local_6d8.bSaveRawData == 0) {
LAB_001adcce:
        bVar3 = true;
        bVar4 = false;
      }
      else {
        if (local_6d8.szCfgFilePath[0] == '\0') {
          uStack_bb0 = 0x6c76647265;
          local_bb8 = 0x696668746170;
          uStack_bb2 = 0x646e;
        }
        else {
          sprintf((char *)&local_bb8,"%.127s",local_6d8.szCfgFilePath);
        }
        sVar6 = strlen((char *)&local_bb8);
        iVar5 = (int)sVar6 + 1;
        uVar7 = sVar6 & 0xffffffff;
        do {
          if ((int)uVar7 < 1) goto LAB_001ad79f;
          uVar1 = uVar7 - 1;
          iVar5 = iVar5 + -1;
          pcVar2 = &cStack_bb9 + uVar7;
          uVar7 = uVar1;
        } while (*pcVar2 != '.');
        if ((uVar1 != 0) && (iVar5 <= (int)sVar6)) {
          memset((void *)((long)&local_bb8 + (uVar1 & 0xffffffff)),0,sVar6 - (uVar1 & 0xffffffff));
        }
LAB_001ad79f:
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        strtimeex_fns();
        sprintf(local_138,"log/%.127s_%.64s.txt",&local_bb8);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        local_6d8.pfSaveFile = (FILE *)fopen(local_138,"wb");
        bVar4 = false;
        if ((FILE *)local_6d8.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create PathfinderDVL data file.");
          bVar4 = false;
          goto LAB_001adcf1;
        }
      }
    }
    if (bExit != 0) {
LAB_001adcf1:
      if (local_bc0 == 0) {
        clock_gettime(4,(timespec *)&local_c58);
        local_bf0._8_8_ = local_c58.sup;
        local_bf0._0_8_ = local_c58.inf;
        local_c58.inf =
             (double)((((long)local_c58.inf + local_be0._0_8_) - local_c00.tv_sec) +
                     ((long)local_c58.sup + local_be0._8_8_) / 1000000000);
        local_c58.sup =
             (double)(((long)local_c58.sup + local_be0._8_8_) % 1000000000 - local_c00.tv_nsec);
        if ((long)local_c58.sup < 0) {
          local_c58.inf =
               (double)((long)local_c58.inf + ~((ulong)-(long)local_c58.sup / 1000000000));
          local_c58.sup =
               (double)((long)local_c58.sup + 1000000000 +
                       ((ulong)-(long)local_c58.sup / 1000000000) * 1000000000);
        }
        local_be0._8_8_ = local_c58.sup;
        local_be0._0_8_ = local_c58.inf;
      }
      if ((FILE *)local_6d8.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_6d8.pfSaveFile);
        local_6d8.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar4) {
        DisconnectPathfinderDVL(&local_6d8);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE PathfinderDVLThread(void* pParam)
{
	PATHFINDERDVL pathfinderdvl;
	NMEADATA nmeadata;
	//double vrx = 0, vry = 0, vrz = 0, alt = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&pathfinderdvl, 0, sizeof(PATHFINDERDVL));
	
	memset(&nmeadata, 0, sizeof(nmeadata));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		//mSleep(threadperiod);

		if (bPausePathfinderDVL)
		{
			if (bConnected)
			{
				printf("PathfinderDVL paused.\n");
				bConnected = FALSE;
				DisconnectPathfinderDVL(&pathfinderdvl);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartPathfinderDVL)
		{
			if (bConnected)
			{
				printf("Restarting a PathfinderDVL.\n");
				bConnected = FALSE;
				DisconnectPathfinderDVL(&pathfinderdvl);
			}
			bRestartPathfinderDVL = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectPathfinderDVL(&pathfinderdvl, "PathfinderDVL0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = pathfinderdvl.threadperiod;

				memset(&nmeadata, 0, sizeof(nmeadata));

				if (pathfinderdvl.pfSaveFile != NULL)
				{
					fclose(pathfinderdvl.pfSaveFile); 
					pathfinderdvl.pfSaveFile = NULL;
				}
				if ((pathfinderdvl.bSaveRawData)&&(pathfinderdvl.pfSaveFile == NULL)) 
				{
					if (strlen(pathfinderdvl.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", pathfinderdvl.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "pathfinderdvl");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					pathfinderdvl.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (pathfinderdvl.pfSaveFile == NULL) 
					{
						printf("Unable to create PathfinderDVL data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetNMEASentencePathfinderDVL(&pathfinderdvl, &nmeadata) == EXIT_SUCCESS)
			{
				EnterCriticalSection(&StateVariablesCS);

				if (pathfinderdvl.bEnable_PD6_SA||pathfinderdvl.bEnable_PD6_TS||pathfinderdvl.bEnable_PD6_BI||pathfinderdvl.bEnable_PD6_BS||
					pathfinderdvl.bEnable_PD6_BE||pathfinderdvl.bEnable_PD6_BD)
				{
					if (pathfinderdvl.bEnable_PD6_SA)
					{
						psi_ahrs = fmod_2PI(M_PI/2.0-nmeadata.Heading-angle_env)+interval(-psi_ahrs_acc, psi_ahrs_acc);
						theta_ahrs = -nmeadata.Pitch+interval(-theta_ahrs_acc, theta_ahrs_acc);
						phi_ahrs = nmeadata.Roll+interval(-phi_ahrs_acc, phi_ahrs_acc);
					}

					if (pathfinderdvl.bEnable_PD6_BS)
					{
						if (nmeadata.vstatus_ship == 'A')
						{
							vrx_dvl = nmeadata.vl_ship+interval(-dvl_acc, dvl_acc);
							vry_dvl = -nmeadata.vt_ship+interval(-dvl_acc, dvl_acc);
							vrz_dvl = nmeadata.vn_ship+interval(-dvl_acc, dvl_acc);
						}
						else if (nmeadata.vstatus_ship == 'V')
						{
							vrx_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
							vry_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
							vrz_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
						}
					}

					if (pathfinderdvl.bEnable_PD6_BE)
					{
						if (nmeadata.vstatus_earth == 'A')
						{
							sog = nmeadata.SOG;
							psi_dvl = fmod_2PI(M_PI/2.0-nmeadata.COG-angle_env)+interval(-M_PI,M_PI);
						}
					}

					if (pathfinderdvl.bEnable_PD6_BD)
					{
						if (nmeadata.timesincelastgood < 4) altitude_AGL = nmeadata.Altitude_AGL;
					}
				}

				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to a PathfinderDVL lost.\n");
				bConnected = FALSE;
				DisconnectPathfinderDVL(&pathfinderdvl);
				mSleep(threadperiod);
			}
		}

		//printf("PathfinderDVLThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (pathfinderdvl.pfSaveFile != NULL)
	{
		fclose(pathfinderdvl.pfSaveFile); 
		pathfinderdvl.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectPathfinderDVL(&pathfinderdvl);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}